

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayDisposer::dispose<capnp::_::RpcSystemBase::RpcConnectionState::Question>
          (ArrayDisposer *this,Question *firstElement,size_t elementCount,size_t capacity)

{
  size_t capacity_local;
  size_t elementCount_local;
  Question *firstElement_local;
  ArrayDisposer *this_local;
  
  (**this->_vptr_ArrayDisposer)
            (this,firstElement,0x28,elementCount,capacity,
             Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Question>::destruct);
  return;
}

Assistant:

void ArrayDisposer::dispose(T* firstElement, size_t elementCount, size_t capacity) const {
  if constexpr (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, nullptr);
  } else {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, &Dispose_<T>::destruct);
  }
}